

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

char * sysbvm_system_getObjectFileName(void)

{
  return "elf";
}

Assistant:

SYSBVM_API const char *sysbvm_system_getObjectFileName(void)
{
#if defined(_WIN32)
    return "coff";
#elif defined(__APPLE__)
    return "macho";
#else
    return "elf";
#endif
}